

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void re2::FactorAlternationImpl::Round3
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  Regexp *pRVar1;
  ulong uVar2;
  ostream *poVar3;
  CharClass *pCVar4;
  ulong uVar5;
  Rune *pRVar6;
  ulong uVar7;
  ulong uVar8;
  CharClassBuilder ccb;
  Regexp *re;
  int local_244;
  undefined1 local_240 [32];
  ulong local_220;
  ulong local_218;
  vector<re2::Splice,std::allocator<re2::Splice>> *local_210;
  Regexp *local_208;
  ulong local_200;
  ulong local_1f8;
  CharClassBuilder local_1f0;
  LogMessage local_1b0;
  
  if (-1 < nsub) {
    uVar2 = (ulong)(uint)nsub;
    uVar5 = (ulong)(nsub + 1);
    uVar7 = 0;
    uVar8 = 0;
    local_208 = (Regexp *)0x0;
    local_220 = uVar2;
    local_218 = uVar5;
    local_210 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
    do {
      pRVar1 = local_208;
      if ((((uVar2 <= uVar7) || (pRVar1 = sub[uVar7], local_208 == (Regexp *)0x0)) ||
          ((local_208->op_ != '\x14' && (local_208->op_ != '\x03')))) ||
         ((pRVar1->op_ != '\x03' && (pRVar1->op_ != '\x14')))) {
        local_208 = pRVar1;
        if (uVar7 != (int)uVar8 + 1 && uVar7 != uVar8) {
          CharClassBuilder::CharClassBuilder(&local_1f0);
          uVar2 = (ulong)(int)uVar8;
          local_200 = uVar2;
          local_1f8 = uVar8;
          if ((long)uVar2 < (long)uVar7) {
            do {
              pRVar1 = sub[uVar2];
              if (pRVar1->op_ == '\x03') {
                CharClassBuilder::AddRangeFlags
                          (&local_1f0,(pRVar1->field_7).rune_,(pRVar1->field_7).rune_,
                           (uint)pRVar1->parse_flags_);
              }
              else if (pRVar1->op_ == '\x14') {
                pCVar4 = (pRVar1->field_7).field_3.cc_;
                if (*(int *)(pCVar4 + 0x10) != 0) {
                  pRVar6 = *(Rune **)(pCVar4 + 8);
                  do {
                    CharClassBuilder::AddRange(&local_1f0,*pRVar6,pRVar6[1]);
                    pRVar6 = pRVar6 + 2;
                  } while (pRVar6 != (Rune *)((long)*(int *)(pCVar4 + 0x10) * 8 +
                                             *(long *)(pCVar4 + 8)));
                }
              }
              else {
                LogMessage::LogMessage
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
                           ,0x49e);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)&local_1b0 + 8),"RE2: unexpected op: ",0x14);
                poVar3 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)((long)&local_1b0 + 8),(uint)pRVar1->op_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                Regexp::ToString_abi_cxx11_((string *)local_240,pRVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,(char *)local_240._0_8_,local_240._8_8_);
                if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
                  operator_delete((void *)local_240._0_8_);
                }
                LogMessage::~LogMessage(&local_1b0);
              }
              Regexp::Decref(pRVar1);
              uVar2 = uVar2 + 1;
            } while ((uVar2 & 0xffffffff) != uVar7);
          }
          pCVar4 = CharClassBuilder::GetCharClass(&local_1f0);
          local_1b0._0_8_ = Regexp::NewCharClass(pCVar4,flags);
          uVar8 = local_1f8;
          local_240._0_8_ = sub + local_200;
          local_244 = (int)uVar7 - (int)local_1f8;
          std::vector<re2::Splice,std::allocator<re2::Splice>>::
          emplace_back<re2::Regexp*&,re2::Regexp**,int>
                    (local_210,(Regexp **)&local_1b0,(Regexp ***)local_240,&local_244);
          std::
          _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
          ::~_Rb_tree(&local_1f0.ranges_._M_t);
          uVar2 = local_220;
          uVar5 = local_218;
        }
        uVar8 = uVar8 & 0xffffffff;
        if (uVar7 < uVar2) {
          uVar8 = uVar7 & 0xffffffff;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  return;
}

Assistant:

void FactorAlternationImpl::Round3(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 3: Merge runs of literals and/or character classes.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // are either literals (i.e. runes) or character classes.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = sub[i];
      if (first != NULL &&
          (first->op() == kRegexpLiteral ||
           first->op() == kRegexpCharClass) &&
          (first_i->op() == kRegexpLiteral ||
           first_i->op() == kRegexpCharClass))
        continue;
    }

    // Found end of a run of Literal/CharClass:
    // sub[start:i] all are either one or the other,
    // but sub[i] is not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      Regexp* re = Regexp::NewCharClass(ccb.GetCharClass(), flags);
      splices->emplace_back(re, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}